

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::mul<(moira::Instr)80>(Moira *this,u32 op1,u32 op2)

{
  uint uVar1;
  u32 uVar2;
  
  uVar2 = (int)(short)op2 * (int)(short)(u16)op1;
  (this->reg).sr.n = SUB41(uVar2 >> 0x1f,0);
  (this->reg).sr.z = uVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar1 = cyclesMul<(moira::Instr)80>(this,(u16)op1);
  (*this->_vptr_Moira[0x19])(this,(ulong)uVar1);
  return uVar2;
}

Assistant:

u32
Moira::mul(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

         case MULS:
         {
             result = (i16)op1 * (i16)op2;
             break;
         }
         case MULU:
         {
             result = op1 * op2;
             break;
         }
        default: assert(false);
     }

    reg.sr.n = NBIT<Long>(result);
    reg.sr.z = ZERO<Long>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;

    sync(cyclesMul<I>(op1));
    return result;
}